

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O2

Value * __thiscall
GlobOptBlockData::MergeValues
          (GlobOptBlockData *this,Value *toDataValue,Value *fromDataValue,Sym *fromDataSym,
          bool isLoopBackEdge,bool forceUniqueValue,
          BVSparse<Memory::JitArenaAllocator> *symsRequiringCompensation,
          BVSparse<Memory::JitArenaAllocator> *symsCreatedForMerge)

{
  uint uVar1;
  Value *pVVar2;
  GlobOpt *this_00;
  Sym *sym;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  uint *puVar6;
  ValueInfo *valueInfo;
  Value **ppVVar7;
  undefined4 *puVar8;
  Value *local_70;
  Value *local_68;
  undefined1 local_5c [8];
  ValueNumberPair sourceValueNumberPair;
  
  if (toDataValue != fromDataValue) {
    local_5c._0_4_ = toDataValue->valueNumber;
    local_5c._4_4_ = fromDataValue->valueNumber;
    sourceValueNumberPair.first._0_1_ = 1;
    puVar6 = JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>::First
                       ((Pair<unsigned_int,_unsigned_int,_DefaultComparer> *)local_5c);
    uVar5 = *puVar6;
    puVar6 = JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>::Second
                       ((Pair<unsigned_int,_unsigned_int,_DefaultComparer> *)local_5c);
    uVar1 = *puVar6;
    local_68 = fromDataValue;
    valueInfo = MergeValueInfo(this,toDataValue,fromDataValue,fromDataSym,isLoopBackEdge,
                               uVar5 == uVar1,symsRequiringCompensation,symsCreatedForMerge);
    if (valueInfo == (ValueInfo *)0x0) {
      toDataValue = (Value *)0x0;
    }
    else if ((uVar5 != uVar1) || (valueInfo != toDataValue->valueInfo)) {
      if (forceUniqueValue) {
        sourceValueNumberPair._4_8_ = GlobOpt::NewValue(this->globOpt,valueInfo);
      }
      else {
        local_70 = (Value *)0x0;
        ppVVar7 = JsUtil::
                  BaseDictionary<JsUtil::Pair<unsigned_int,unsigned_int,DefaultComparer>,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  ::LookupWithKey<JsUtil::Pair<unsigned_int,unsigned_int,DefaultComparer>>
                            ((BaseDictionary<JsUtil::Pair<unsigned_int,unsigned_int,DefaultComparer>,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                              *)this->globOpt->valuesCreatedForMerge,
                             (Pair<unsigned_int,_unsigned_int,_DefaultComparer> *)local_5c,&local_70
                            );
        pVVar2 = *ppVVar7;
        sourceValueNumberPair._4_8_ = pVVar2;
        if (pVVar2 == (Value *)0x0) {
          this_00 = this->globOpt;
          if (uVar5 == uVar1) {
            puVar6 = JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>::First
                               ((Pair<unsigned_int,_unsigned_int,_DefaultComparer> *)local_5c);
            uVar5 = *puVar6;
          }
          else {
            uVar5 = GlobOpt::NewValueNumber(this_00);
          }
          sourceValueNumberPair._4_8_ = GlobOpt::NewValue(this_00,uVar5,valueInfo);
          JsUtil::
          BaseDictionary<JsUtil::Pair<unsigned_int,unsigned_int,DefaultComparer>,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<JsUtil::Pair<unsigned_int,unsigned_int,DefaultComparer>,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                    ((BaseDictionary<JsUtil::Pair<unsigned_int,unsigned_int,DefaultComparer>,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this->globOpt->valuesCreatedForMerge,
                     (Pair<unsigned_int,_unsigned_int,_DefaultComparer> *)local_5c,
                     (Value **)&sourceValueNumberPair.second);
        }
        else {
          if ((pVVar2->valueNumber != toDataValue->valueNumber) == (uVar5 == uVar1)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar8 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                               ,0x38b,
                               "(sameValueNumber == (newValue->GetValueNumber() == toDataValue->GetValueNumber()))"
                               ,
                               "sameValueNumber == (newValue->GetValueNumber() == toDataValue->GetValueNumber())"
                              );
            if (!bVar4) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *puVar8 = 0;
          }
          pVVar2->valueInfo = valueInfo;
        }
      }
      sym = toDataValue->valueInfo->symStore;
      toDataValue = (Value *)sourceValueNumberPair._4_8_;
      if (sym == local_68->valueInfo->symStore) {
        GlobOpt::SetSymStoreDirect(this->globOpt,valueInfo,sym);
        toDataValue = (Value *)sourceValueNumberPair._4_8_;
      }
    }
  }
  return toDataValue;
}

Assistant:

Value *
GlobOptBlockData::MergeValues(
    Value *toDataValue,
    Value *fromDataValue,
    Sym *fromDataSym,
    bool isLoopBackEdge,
    bool forceUniqueValue,
    BVSparse<JitArenaAllocator> *const symsRequiringCompensation,
    BVSparse<JitArenaAllocator> *const symsCreatedForMerge)
{
    // Same map
    if (toDataValue == fromDataValue)
    {
        return toDataValue;
    }

    const ValueNumberPair sourceValueNumberPair(toDataValue->GetValueNumber(), fromDataValue->GetValueNumber());
    const bool sameValueNumber = sourceValueNumberPair.First() == sourceValueNumberPair.Second();

    ValueInfo *newValueInfo =
        this->MergeValueInfo(
            toDataValue,
            fromDataValue,
            fromDataSym,
            isLoopBackEdge,
            sameValueNumber,
            symsRequiringCompensation,
            symsCreatedForMerge);

    if (newValueInfo == nullptr)
    {
        return nullptr;
    }

    if (sameValueNumber && newValueInfo == toDataValue->GetValueInfo())
    {
        return toDataValue;
    }

    Value *newValue = nullptr;
    if (forceUniqueValue)
    {
        newValue = this->globOpt->NewValue(newValueInfo);
    }
    else
    {
        // There may be other syms in toData that haven't been merged yet, referring to the current toData value for this sym. If
        // the merge produced a new value info, don't corrupt the value info for the other sym by changing the same value. Instead,
        // create one value per source value number pair per merge and reuse that for new value infos.
        newValue = this->globOpt->valuesCreatedForMerge->Lookup(sourceValueNumberPair, nullptr);
        if (newValue)
        {
            Assert(sameValueNumber == (newValue->GetValueNumber() == toDataValue->GetValueNumber()));

            // This is an exception where Value::SetValueInfo is called directly instead of GlobOpt::ChangeValueInfo, because we're
            // actually generating new value info through merges.
            newValue->SetValueInfo(newValueInfo);
        }
        else
        {
            newValue = this->globOpt->NewValue(sameValueNumber ? sourceValueNumberPair.First() : this->globOpt->NewValueNumber(), newValueInfo);
            this->globOpt->valuesCreatedForMerge->Add(sourceValueNumberPair, newValue);
        }
    }

    // Set symStore if same on both paths.
    if (toDataValue->GetValueInfo()->GetSymStore() == fromDataValue->GetValueInfo()->GetSymStore())
    {
        this->globOpt->SetSymStoreDirect(newValueInfo, toDataValue->GetValueInfo()->GetSymStore());
    }

    return newValue;
}